

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestacceptorFixturenextLogonResetSeqNumFlag::RunImpl
          (TestacceptorFixturenextLogonResetSeqNumFlag *this)

{
  TestDetails *details;
  acceptorFixturenextLogonResetSeqNumFlagHelper fixtureHelper;
  acceptorFixturenextLogonResetSeqNumFlagHelper local_660;
  
  details = &(this->super_Test).m_details;
  acceptorFixturenextLogonResetSeqNumFlagHelper::acceptorFixturenextLogonResetSeqNumFlagHelper
            (&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::acceptorFixturenextLogonResetSeqNumFlagHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture((sessionFixture *)&local_660);
  return;
}

Assistant:

TEST_FIXTURE(acceptorFixture, nextLogonResetSeqNumFlag)
{
  object->setResponder( this );
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );

  object->next( createLogout( "ISLD", "TW", 2 ), UtcTimeStamp() );
  CHECK( !object->receivedLogon() );
  CHECK_EQUAL( 1, disconnected );
  CHECK_EQUAL( 1, toLogout );
  CHECK_EQUAL( 1, fromLogout );
  CHECK_EQUAL( 3, object->getExpectedSenderNum() );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );

  FIX42::Logon logon = createLogon( "ISLD", "TW", 1 );
  logon.set( FIX::ResetSeqNumFlag(true) );
  object->next( logon, UtcTimeStamp() );
  CHECK_EQUAL( 2, object->getExpectedSenderNum() );
  CHECK_EQUAL( 2, object->getExpectedTargetNum() );
}